

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitCallTarget(ParseNode *pnodeTarget,BOOL fSideEffectArgs,RegSlot *thisLocation,
                   bool *releaseThisLocation,RegSlot *callObjLocation,
                   ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                   ProfileId *callApplyCallSiteId)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  ProfileId PVar4;
  PropertyId PVar5;
  RegSlot RVar6;
  uint uVar7;
  ParseNodeName *pPVar8;
  ParseNodeBin *pPVar9;
  ByteCodeWriter *this;
  ParseNodeBin *pPVar10;
  ParseNodeSuperReference *pPVar11;
  undefined4 *puVar12;
  PropertyId propertyId_1;
  ParseNodeName *pnodeNameTarget;
  RegSlot protoLocation_1;
  RegSlot indexLocation;
  uint cacheId;
  RegSlot protoLocation;
  PropertyId propertyId;
  ParseNodeBin *pnodeBinTarget;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot *callObjLocation_local;
  bool *releaseThisLocation_local;
  RegSlot *thisLocation_local;
  BOOL fSideEffectArgs_local;
  ParseNode *pnodeTarget_local;
  
  *releaseThisLocation = true;
  OVar1 = pnodeTarget->nop;
  if (OVar1 == knopName) {
    pPVar8 = ParseNode::AsParseNodeName(pnodeTarget);
    bVar3 = ParseNodeName::IsSpecialName(pPVar8);
    if (!bVar3) {
      FuncInfo::AcquireLoc(funcInfo,&pPVar8->super_ParseNode);
      if (fSideEffectArgs != 0) {
        SaveOpndValue(&pPVar8->super_ParseNode,funcInfo);
      }
      ByteCodeGenerator::EmitLoadInstance
                (byteCodeGenerator,pPVar8->sym,pPVar8->pid,thisLocation,callObjLocation,funcInfo);
      if (*callObjLocation != 0xffffffff) {
        PVar5 = ParseNodeName::PropertyIdFromNameNode(pPVar8);
        EmitMethodFld(&pPVar8->super_ParseNode,*callObjLocation,PVar5,byteCodeGenerator,funcInfo,
                      true);
        goto LAB_00b4b157;
      }
    }
LAB_00b4b130:
    Emit(pnodeTarget,byteCodeGenerator,funcInfo,0,false,false);
    *thisLocation = funcInfo->undefinedConstantRegister;
    goto LAB_00b4b157;
  }
  if (OVar1 != knopDot) {
    if (OVar1 != knopIndex) goto LAB_00b4b130;
    FuncInfo::AcquireLoc(funcInfo,pnodeTarget);
    if (fSideEffectArgs == 0) {
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      uVar7 = ParseNode::Grfnop((uint)pPVar10->pnode2->nop);
      if ((uVar7 & 2) == 0) goto LAB_00b4af02;
    }
    else {
LAB_00b4af02:
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      SaveOpndValue(pPVar10->pnode1,funcInfo);
    }
    pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
    Emit(pPVar10->pnode1,byteCodeGenerator,funcInfo,0,false,false);
    pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
    Emit(pPVar10->pnode2,byteCodeGenerator,funcInfo,0,false,false);
    pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
    RVar6 = pPVar10->pnode2->location;
    pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
    pnodeNameTarget._4_4_ = pPVar10->pnode1->location;
    pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
    bVar3 = ByteCodeGenerator::IsSuper(pPVar10->pnode1);
    if (bVar3) {
      pPVar11 = ParseNode::AsParseNodeSuperReference(pnodeTarget);
      Emit((ParseNode *)pPVar11->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
      pnodeNameTarget._4_4_ =
           ByteCodeGenerator::EmitLdObjProto
                     (byteCodeGenerator,LdHomeObjProto,pnodeNameTarget._4_4_,funcInfo);
      pPVar11 = ParseNode::AsParseNodeSuperReference(pnodeTarget);
      FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar11->pnodeThis);
      pPVar11 = ParseNode::AsParseNodeSuperReference(pnodeTarget);
      *thisLocation = (pPVar11->pnodeThis->super_ParseNodeName).super_ParseNode.location;
      *releaseThisLocation = false;
    }
    else {
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      *thisLocation = pPVar10->pnode1->location;
    }
    EmitMethodElem(pnodeTarget,pnodeNameTarget._4_4_,RVar6,byteCodeGenerator);
    pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
    FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnode2);
    pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
    bVar3 = ByteCodeGenerator::IsSuper(pPVar10->pnode1);
    if (bVar3) {
      pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
      FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnode1);
    }
    goto LAB_00b4b157;
  }
  pPVar10 = ParseNode::AsParseNodeBin(pnodeTarget);
  FuncInfo::AcquireLoc(funcInfo,&pPVar10->super_ParseNode);
  if (fSideEffectArgs != 0) {
    SaveOpndValue(pPVar10->pnode1,funcInfo);
  }
  if (pPVar10->pnode2->nop != knopName) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1f89,"(pnodeBinTarget->pnode2->nop == knopName)",
                       "pnodeBinTarget->pnode2->nop == knopName");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  pPVar8 = ParseNode::AsParseNodeName(pPVar10->pnode2);
  PVar5 = ParseNodeName::PropertyIdFromNameNode(pPVar8);
  if (PVar5 == 0x4e) {
LAB_00b4ad3a:
    FuncInfo::EnsureCallSiteToCallApplyCallSiteMap(funcInfo);
    PVar4 = ByteCodeGenerator::GetNextCallApplyCallSiteId(byteCodeGenerator,CallI);
    *callApplyCallSiteId = PVar4;
    ParseNode::SetIsCallApplyTargetLoad(pPVar10->pnode1);
  }
  else {
    pPVar9 = ParseNode::AsParseNodeBin(pnodeTarget);
    pPVar8 = ParseNode::AsParseNodeName(pPVar9->pnode2);
    PVar5 = ParseNodeName::PropertyIdFromNameNode(pPVar8);
    if (PVar5 == 0x5a) goto LAB_00b4ad3a;
  }
  Emit(pPVar10->pnode1,byteCodeGenerator,funcInfo,0,false,false);
  pPVar8 = ParseNode::AsParseNodeName(pPVar10->pnode2);
  PVar5 = ParseNodeName::PropertyIdFromNameNode(pPVar8);
  RVar6 = pPVar10->pnode1->location;
  bVar3 = ByteCodeGenerator::IsSuper(pPVar10->pnode1);
  if (bVar3) {
    pPVar11 = ParseNode::AsParseNodeSuperReference(&pPVar10->super_ParseNode);
    Emit((ParseNode *)pPVar11->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
    RVar6 = ByteCodeGenerator::EmitLdObjProto(byteCodeGenerator,LdHomeObjProto,RVar6,funcInfo);
    pPVar11 = ParseNode::AsParseNodeSuperReference(&pPVar10->super_ParseNode);
    FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar11->pnodeThis);
    FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnode1);
    pPVar11 = ParseNode::AsParseNodeSuperReference(&pPVar10->super_ParseNode);
    *thisLocation = (pPVar11->pnodeThis->super_ParseNodeName).super_ParseNode.location;
    *releaseThisLocation = false;
    uVar7 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar6,PVar5,false,false);
    this = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::PatchablePropertyWithThisPtr
              (this,LdSuperFld,pnodeTarget->location,RVar6,*thisLocation,uVar7,false,true);
  }
  else {
    *thisLocation = pPVar10->pnode1->location;
    EmitMethodFld(&pPVar10->super_ParseNode,RVar6,PVar5,byteCodeGenerator,funcInfo,true);
  }
LAB_00b4b157:
  if (*thisLocation == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1ffb,"(*thisLocation != Js::Constants::NoRegister)",
                       "*thisLocation != Js::Constants::NoRegister");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  return;
}

Assistant:

void EmitCallTarget(
    ParseNode *pnodeTarget,
    BOOL fSideEffectArgs,
    Js::RegSlot *thisLocation,
    bool *releaseThisLocation,
    Js::RegSlot *callObjLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId * callApplyCallSiteId)
{
    // - emit target
    //    - assign this
    // - emit args
    // - do call

    // The call target is fully evaluated before the argument list. Note that we're not handling
    // put-call cases here currently, as such cases only apply to host objects
    // and are very unlikely to behave differently depending on the order of evaluation.

    *releaseThisLocation = true;

    switch (pnodeTarget->nop)
    {
    case knopDot:
    {
        ParseNodeBin * pnodeBinTarget = pnodeTarget->AsParseNodeBin();
        funcInfo->AcquireLoc(pnodeBinTarget);
        // Assign the call target operand(s), putting them into expression temps if necessary to protect
        // them from side-effects.
        if (fSideEffectArgs)
        {
            // Though we're done with target evaluation after this point, still protect opnd1 from
            // arg side-effects as it's the "this" pointer.
            SaveOpndValue(pnodeBinTarget->pnode1, funcInfo);
        }

        Assert(pnodeBinTarget->pnode2->nop == knopName);
        if ((pnodeBinTarget->pnode2->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::apply) || (pnodeTarget->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::call))
        {
            funcInfo->EnsureCallSiteToCallApplyCallSiteMap();
            
            *callApplyCallSiteId = byteCodeGenerator->GetNextCallApplyCallSiteId(Js::OpCode::CallI);
            pnodeBinTarget->pnode1->SetIsCallApplyTargetLoad();
        }

        Emit(pnodeBinTarget->pnode1, byteCodeGenerator, funcInfo, false);
        Js::PropertyId propertyId = pnodeBinTarget->pnode2->AsParseNodeName()->PropertyIdFromNameNode();
        Js::RegSlot protoLocation = pnodeBinTarget->pnode1->location;

        if (ByteCodeGenerator::IsSuper(pnodeBinTarget->pnode1))
        {
            Emit(pnodeBinTarget->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            protoLocation = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, protoLocation, funcInfo);
            funcInfo->ReleaseLoc(pnodeBinTarget->AsParseNodeSuperReference()->pnodeThis);
            funcInfo->ReleaseLoc(pnodeBinTarget->pnode1);

            // Function calls on the 'super' object should maintain current 'this' pointer.
            *thisLocation = pnodeBinTarget->AsParseNodeSuperReference()->pnodeThis->location;
            *releaseThisLocation = false;

            uint cacheId = funcInfo->FindOrAddInlineCacheId(protoLocation, propertyId, false, false);
            byteCodeGenerator->Writer()->PatchablePropertyWithThisPtr(Js::OpCode::LdSuperFld,
                pnodeTarget->location, protoLocation, *thisLocation, cacheId, false);
        }
        else
        {
            *thisLocation = pnodeBinTarget->pnode1->location;
            EmitMethodFld(pnodeBinTarget, protoLocation, propertyId, byteCodeGenerator, funcInfo);
        }

        break;
    }

    case knopIndex:
    {
        funcInfo->AcquireLoc(pnodeTarget);
        // Assign the call target operand(s), putting them into expression temps if necessary to protect
        // them from side-effects.
        if (fSideEffectArgs || !(ParseNode::Grfnop(pnodeTarget->AsParseNodeBin()->pnode2->nop) & fnopLeaf))
        {
            // Though we're done with target evaluation after this point, still protect opnd1 from
            // arg or opnd2 side-effects as it's the "this" pointer.
            SaveOpndValue(pnodeTarget->AsParseNodeBin()->pnode1, funcInfo);
        }
        Emit(pnodeTarget->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
        Emit(pnodeTarget->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo, false);

        Js::RegSlot indexLocation = pnodeTarget->AsParseNodeBin()->pnode2->location;
        Js::RegSlot protoLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;

        if (ByteCodeGenerator::IsSuper(pnodeTarget->AsParseNodeBin()->pnode1))
        {
            Emit(pnodeTarget->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            protoLocation = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, protoLocation, funcInfo);
            funcInfo->ReleaseLoc(pnodeTarget->AsParseNodeSuperReference()->pnodeThis);

            // Function calls on the 'super' object should maintain current 'this' pointer
            *thisLocation = pnodeTarget->AsParseNodeSuperReference()->pnodeThis->location;
            *releaseThisLocation = false;
        }
        else
        {
            *thisLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;
        }

        EmitMethodElem(pnodeTarget, protoLocation, indexLocation, byteCodeGenerator);

        funcInfo->ReleaseLoc(pnodeTarget->AsParseNodeBin()->pnode2); // don't release indexLocation until after we use it.

        if (ByteCodeGenerator::IsSuper(pnodeTarget->AsParseNodeBin()->pnode1))
        {
            funcInfo->ReleaseLoc(pnodeTarget->AsParseNodeBin()->pnode1);
        }
        break;
    }

    case knopName:
    {
        ParseNodeName * pnodeNameTarget = pnodeTarget->AsParseNodeName();
        if (!pnodeNameTarget->IsSpecialName())
        {
            funcInfo->AcquireLoc(pnodeNameTarget);
            // Assign the call target operand(s), putting them into expression temps if necessary to protect
            // them from side-effects.
            if (fSideEffectArgs)
            {
                SaveOpndValue(pnodeNameTarget, funcInfo);
            }
            byteCodeGenerator->EmitLoadInstance(pnodeNameTarget->sym, pnodeNameTarget->pid, thisLocation, callObjLocation, funcInfo);
            if (*callObjLocation != Js::Constants::NoRegister)
            {
                // Load the call target as a property of the instance.
                Js::PropertyId propertyId = pnodeNameTarget->PropertyIdFromNameNode();
                EmitMethodFld(pnodeNameTarget, *callObjLocation, propertyId, byteCodeGenerator, funcInfo);
                break;
            }
        }

        // FALL THROUGH to evaluate call target.
    }

    default:
        // Assign the call target operand(s), putting them into expression temps if necessary to protect
        // them from side-effects.
        Emit(pnodeTarget, byteCodeGenerator, funcInfo, false);
        *thisLocation = funcInfo->undefinedConstantRegister;
        break;
    }

    // "This" pointer should have been assigned by the above.
    Assert(*thisLocation != Js::Constants::NoRegister);
}